

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int input_intelhex(char *fname,int *start,int *length)

{
  bool bVar1;
  int local_60;
  int local_5c;
  int sum;
  int hlength;
  int hstart;
  int lval;
  int i;
  int sn;
  int lt;
  int ladr;
  int ll;
  int retval;
  int sc;
  int c;
  FILE *fp;
  int *length_local;
  int *start_local;
  char *fname_local;
  
  ladr = 1;
  fp = (FILE *)length;
  length_local = start;
  start_local = (int *)fname;
  _sc = fopen(fname,"r");
  if (_sc == (FILE *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    sum = 0x8000;
    local_5c = 0;
    do {
      memset(sline,0,0x100);
      ll = 0;
      while( true ) {
        retval = fgetc(_sc);
        bVar1 = false;
        if ((retval != -1) && (bVar1 = false, retval != 10)) {
          bVar1 = ll < 0xff;
        }
        if (!bVar1) break;
        sline[ll] = (char)retval;
        ll = ll + 1;
      }
      if ((retval != -1) && ((ll < 0xb || (sline[0] != ':')))) {
        retval = -1;
        ladr = 0;
        printf("Invalid Intel Hex format.\n");
      }
      if ((((retval != -1) && (lval = __isoc99_sscanf(sline,":%2x%4x%2x",&lt,&sn,&i), lval == 3)) &&
          (sn + lt < 0x8001)) && (i == 0)) {
        local_60 = lt + (sn >> 8) + (sn & 0xffU);
        if (sn < sum) {
          sum = sn;
        }
        lval = 3;
        for (hstart = 0; hstart < lt; hstart = hstart + 1) {
          lval = __isoc99_sscanf(sline + (hstart * 2 + 9),"%2x",&hlength);
          ebuf[sn + hstart] = (uint8)hlength;
          local_60 = (hlength & 0xffU) + local_60;
        }
        if (local_5c < (sn + lt) - sum) {
          local_5c = (sn + lt) - sum;
        }
        lval = __isoc99_sscanf(sline + (hstart * 2 + 9),"%2x",&hlength);
        if ((lval == 0) || ((0x100U - local_60 & 0xff) != hlength)) {
          retval = -1;
          ladr = 0;
          printf("Invalid checksum.\n");
        }
      }
    } while (retval != -1);
    if (ladr != 0) {
      fp->_flags = local_5c;
      *length_local = sum;
    }
    fclose(_sc);
    fname_local._4_4_ = ladr;
  }
  return fname_local._4_4_;
}

Assistant:

int input_intelhex(char *fname, int *start, int *length)
{
   FILE *fp;
 
   int c, sc, retval = 1;
   int ll, ladr, lt, sn, i, lval;
   int hstart, hlength, sum;

   fp = fopen(fname, "r");
   if(fp == NULL) 
      return 0;
   hstart = MAXBUF;
   hlength = 0;
   sum = 0;
   do
   {
      memset(sline, 0x00, MAXSLENGTH);
      sc = 0;
      while (((c = fgetc(fp)) != EOF) && (c != 0x0A) && (sc < (MAXSLENGTH -1)))
         sline[sc++] = (uint8)c;
      if ((c != EOF) && ((sc < 11) || (sline[0] != ':')))
      {
         c = EOF;
         retval = 0;
         printf("Invalid Intel Hex format.\n");
      }
      if (c != EOF)
      {
         sn = sscanf(sline , ":%2x%4x%2x", &ll, &ladr, &lt);
         if ((sn == 3) && ((ladr + ll) <= MAXBUF) && (lt == 0))
         {
            sum = ll + (ladr >> 8) + (ladr & 0xff) + lt;
            if(ladr < hstart) hstart = ladr;
            for(i = 0; i < ll ; i++)
            {
               sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
               ebuf[ladr + i] = (uint8)lval;
               sum += (uint8)lval;
            }
            if(((ladr + ll) - hstart) > hlength)
               hlength = (ladr + ll) - hstart;
            sum = (0x100 - sum) & 0xff;
            sn = sscanf(&sline[9 + (i << 1)], "%2x", &lval);
            if (!sn || ((sum - lval) != 0))
            {
               c = EOF;
               retval = 0;
               printf("Invalid checksum.\n");
            }
         }
      }      
   }
   while (c != EOF);
   if (retval)
   {
      *length = hlength;
      *start = hstart;
   }
   fclose(fp);
   
   return retval;
}